

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

bool EOPlus::ctype_ident(char c)

{
  bool bVar1;
  
  if (c == '$') {
    return false;
  }
  bVar1 = ctype_ident_start(c);
  return bVar1 || (int)c - 0x30U < 10;
}

Assistant:

bool ctype_ident(char c) { return c != '$' && (ctype_ident_start(c) || ctype_digit(c)); }